

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O0

int IDAReInit(void *ida_mem,sunrealtype t0,N_Vector yy0,N_Vector yp0)

{
  long in_RDX;
  long in_RSI;
  IDAMem in_RDI;
  sunrealtype in_XMM0_Qa;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x23d,"IDAReInit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_MallocDone == 0) {
    IDAProcessError(in_RDI,-0x17,0x248,"IDAReInit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                    ,"Attempt to call before IDAMalloc.");
    local_4 = -0x17;
  }
  else if (in_RSI == 0) {
    IDAProcessError(in_RDI,-0x16,0x252,"IDAReInit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                    ,"y0 = NULL illegal.");
    local_4 = -0x16;
  }
  else if (in_RDX == 0) {
    IDAProcessError(in_RDI,-0x16,0x25a,"IDAReInit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                    ,"yp0 = NULL illegal.");
    local_4 = -0x16;
  }
  else {
    in_RDI->ida_tn = in_XMM0_Qa;
    N_VScale(0x3ff0000000000000,in_RSI,in_RDI->ida_phi[0]);
    N_VScale(0x3ff0000000000000,in_RDX,in_RDI->ida_phi[1]);
    in_RDI->ida_nst = 0;
    in_RDI->ida_nre = 0;
    in_RDI->ida_ncfn = 0;
    in_RDI->ida_netf = 0;
    in_RDI->ida_nni = 0;
    in_RDI->ida_nnf = 0;
    in_RDI->ida_nsetups = 0;
    in_RDI->ida_kused = 0;
    in_RDI->ida_hused = 0.0;
    in_RDI->ida_tolsf = 1.0;
    in_RDI->ida_nge = 0;
    in_RDI->ida_irfnd = 0;
    in_RDI->ida_SetupDone = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDAReInit(void* ida_mem, sunrealtype t0, N_Vector yy0, N_Vector yp0)
{
  IDAMem IDA_mem;

  /* Check for legal input parameters */

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Check if problem was malloc'ed */

  if (IDA_mem->ida_MallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_MALLOC);
  }

  /* Check for legal input parameters */

  if (yy0 == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_Y0_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  if (yp0 == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_YP0_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Copy the input parameters into IDA memory block */

  IDA_mem->ida_tn = t0;

  /* Initialize the phi array */

  N_VScale(ONE, yy0, IDA_mem->ida_phi[0]);
  N_VScale(ONE, yp0, IDA_mem->ida_phi[1]);

  /* Initialize all the counters and other optional output values */

  IDA_mem->ida_nst     = 0;
  IDA_mem->ida_nre     = 0;
  IDA_mem->ida_ncfn    = 0;
  IDA_mem->ida_netf    = 0;
  IDA_mem->ida_nni     = 0;
  IDA_mem->ida_nnf     = 0;
  IDA_mem->ida_nsetups = 0;

  IDA_mem->ida_kused = 0;
  IDA_mem->ida_hused = ZERO;
  IDA_mem->ida_tolsf = ONE;

  IDA_mem->ida_nge = 0;

  IDA_mem->ida_irfnd = 0;

  /* Initial setup not done yet */

  IDA_mem->ida_SetupDone = SUNFALSE;

  /* Problem has been successfully re-initialized */

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}